

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_move_from_usp(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((((s->base).tb)->flags & 0x2000) == 0) {
    gen_exception(s,(s->base).pc_next,8);
  }
  else {
    ret = get_areg(s,insn & 7);
    tcg_gen_ld_i32(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0x50);
  }
  return;
}

Assistant:

DISAS_INSN(move_from_usp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (IS_USER(s)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }
    tcg_gen_ld_i32(tcg_ctx, AREG(insn, 0), tcg_ctx->cpu_env,
                   offsetof(CPUM68KState, sp[M68K_USP]));
}